

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_descriptor.cpp
# Opt level: O2

void __thiscall Descriptor_Parse_pk_Test::TestBody(Descriptor_Parse_pk_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertHelper local_360;
  string desc_str;
  string descriptor;
  Script locking_script;
  Descriptor desc2;
  Descriptor desc;
  
  std::__cxx11::string::string
            ((string *)&descriptor,
             "pk(02a5613bd857b7048924264d1e70e08fb2a7e6527d32b7ab1bb993ac59964ff397)#rk5v7uqw",
             (allocator *)&desc);
  cfd::core::Descriptor::Descriptor(&desc);
  cfd::core::Script::Script(&locking_script);
  pcVar2 = "";
  std::__cxx11::string::string((string *)&desc_str,"",(allocator *)&desc2);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::Descriptor::Parse
                (&desc2,&descriptor,
                 (vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                  *)0x0);
      cfd::core::Descriptor::operator=(&desc,&desc2);
      cfd::core::DescriptorNode::~DescriptorNode(&desc2.root_node_);
    }
  }
  else {
    testing::Message::Message((Message *)&desc2);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
               ,0x32,
               "Expected: desc = Descriptor::Parse(descriptor) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1,(Message *)&desc2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&desc2);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::Descriptor::GetLockingScript((Script *)&desc2,&desc);
      cfd::core::Script::operator=(&locking_script,(Script *)&desc2);
      cfd::core::Script::~Script((Script *)&desc2);
    }
  }
  else {
    testing::Message::Message((Message *)&desc2);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
               ,0x33,
               "Expected: locking_script = desc.GetLockingScript() doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1,(Message *)&desc2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&desc2);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::Descriptor::ToString_abi_cxx11_((string *)&desc2,&desc,true);
      std::__cxx11::string::operator=((string *)&desc_str,(string *)&desc2);
      std::__cxx11::string::~string((string *)&desc2);
    }
  }
  else {
    testing::Message::Message((Message *)&desc2);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
               ,0x34,
               "Expected: desc_str = desc.ToString() doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1,(Message *)&desc2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&desc2);
  }
  testing::internal::CmpHelperSTREQ
            ((internal *)&desc2,"desc_str.c_str()","descriptor.c_str()",desc_str._M_dataplus._M_p,
             descriptor._M_dataplus._M_p);
  if ((char)desc2.root_node_.name_._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&gtest_ar_1);
    if (desc2.root_node_.name_._M_string_length != 0) {
      pcVar2 = *(char **)desc2.root_node_.name_._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
               ,0x35,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2,(Message *)&gtest_ar_1);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_1);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&desc2.root_node_.name_._M_string_length);
  cfd::core::Script::ToString_abi_cxx11_((string *)&desc2,&locking_script);
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar_1,"locking_script.ToString().c_str()",
             "\"02a5613bd857b7048924264d1e70e08fb2a7e6527d32b7ab1bb993ac59964ff397 OP_CHECKSIG\"",
             (char *)CONCAT71(desc2.root_node_.name_._M_dataplus._M_p._1_7_,
                              (char)desc2.root_node_.name_._M_dataplus._M_p),
             "02a5613bd857b7048924264d1e70e08fb2a7e6527d32b7ab1bb993ac59964ff397 OP_CHECKSIG");
  std::__cxx11::string::~string((string *)&desc2);
  if (gtest_ar_1.success_ == false) {
    testing::Message::Message((Message *)&desc2);
    if (gtest_ar_1.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
               ,0x37,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2,(Message *)&desc2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&desc2);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_1.message_);
  cfd::core::Descriptor::Descriptor(&desc2,&desc);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::Descriptor::GetLockingScript((Script *)&gtest_ar_1,&desc);
      cfd::core::Script::operator=(&locking_script,(Script *)&gtest_ar_1);
      cfd::core::Script::~Script((Script *)&gtest_ar_1);
    }
  }
  else {
    testing::Message::Message((Message *)&gtest_ar_1);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
               ,0x3b,
               "Expected: locking_script = desc.GetLockingScript() doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2,(Message *)&gtest_ar_1);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_1);
  }
  cfd::core::Script::ToString_abi_cxx11_((string *)&gtest_ar_1,&locking_script);
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar_2,"locking_script.ToString().c_str()",
             "\"02a5613bd857b7048924264d1e70e08fb2a7e6527d32b7ab1bb993ac59964ff397 OP_CHECKSIG\"",
             (char *)CONCAT71(gtest_ar_1._1_7_,gtest_ar_1.success_),
             "02a5613bd857b7048924264d1e70e08fb2a7e6527d32b7ab1bb993ac59964ff397 OP_CHECKSIG");
  std::__cxx11::string::~string((string *)&gtest_ar_1);
  if (gtest_ar_2.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_1);
    if (gtest_ar_2.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_360,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
               ,0x3d,pcVar2);
    testing::internal::AssertHelper::operator=(&local_360,(Message *)&gtest_ar_1);
    testing::internal::AssertHelper::~AssertHelper(&local_360);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_1);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_2.message_);
  cfd::core::DescriptorNode::~DescriptorNode(&desc2.root_node_);
  std::__cxx11::string::~string((string *)&desc_str);
  cfd::core::Script::~Script(&locking_script);
  cfd::core::DescriptorNode::~DescriptorNode(&desc.root_node_);
  std::__cxx11::string::~string((string *)&descriptor);
  return;
}

Assistant:

TEST(Descriptor, Parse_pk) {
  // cfd::core::CfdCoreHandle handle = nullptr;
  // cfd::core::Initialize(&handle);
  std::string descriptor = "pk(02a5613bd857b7048924264d1e70e08fb2a7e6527d32b7ab1bb993ac59964ff397)#rk5v7uqw";
  Descriptor desc;
  Script locking_script;
  std::string desc_str = "";

  EXPECT_NO_THROW(desc = Descriptor::Parse(descriptor));
  EXPECT_NO_THROW(locking_script = desc.GetLockingScript());
  EXPECT_NO_THROW(desc_str = desc.ToString());
  EXPECT_STREQ(desc_str.c_str(), descriptor.c_str());
  EXPECT_STREQ(locking_script.ToString().c_str(),
    "02a5613bd857b7048924264d1e70e08fb2a7e6527d32b7ab1bb993ac59964ff397 OP_CHECKSIG");

  // copy constructor
  Descriptor desc2(desc);
  EXPECT_NO_THROW(locking_script = desc.GetLockingScript());
  EXPECT_STREQ(locking_script.ToString().c_str(),
    "02a5613bd857b7048924264d1e70e08fb2a7e6527d32b7ab1bb993ac59964ff397 OP_CHECKSIG");
}